

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

string * __thiscall
symbols::BoolObject::toString_abi_cxx11_(string *__return_storage_ptr__,BoolObject *this)

{
  allocator<char> local_2d [20];
  allocator<char> local_19;
  BoolObject *local_18;
  BoolObject *this_local;
  
  local_18 = this;
  this_local = (BoolObject *)__return_storage_ptr__;
  if (((this->super_Object).field_0xc & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"false",local_2d);
    std::allocator<char>::~allocator(local_2d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"true",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BoolObject::toString() const
{
    if(value)
        return "true";
    return "false";

}